

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSetStringSpan *otherStringSpan,
          UVector *newParentSetStrings)

{
  UnicodeSet *o;
  ulong __n;
  int iVar1;
  undefined4 extraout_var;
  int32_t *piVar2;
  int in_ECX;
  void *__child_stack;
  UnicodeSet *__fn;
  void *in_R8;
  UnicodeSet *this_00;
  
  this_00 = &this->spanSet;
  o = &otherStringSpan->spanSet;
  __fn = o;
  UnicodeSet::UnicodeSet(this_00,o);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = newParentSetStrings;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = otherStringSpan->utf8Length;
  this->maxLength16 = otherStringSpan->maxLength16;
  this->maxLength8 = otherStringSpan->maxLength8;
  this->all = '\x01';
  if (otherStringSpan->pSpanNotSet != o) {
    iVar1 = UnicodeSet::clone(otherStringSpan->pSpanNotSet,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    this_00 = (UnicodeSet *)CONCAT44(extraout_var,iVar1);
  }
  this->pSpanNotSet = this_00;
  iVar1 = this->strings->count;
  __n = (long)this->utf8Length + (long)iVar1 * 8;
  if ((int)__n < 0x81) {
    this->utf8Lengths = this->staticLengths;
  }
  else {
    piVar2 = (int32_t *)uprv_malloc_63(__n & 0xffffffff);
    this->utf8Lengths = piVar2;
    if (piVar2 == (int32_t *)0x0) {
      this->maxLength16 = 0;
      this->maxLength8 = 0;
      return;
    }
  }
  piVar2 = this->utf8Lengths + iVar1;
  this->spanLengths = (uint8_t *)piVar2;
  this->utf8 = (uint8_t *)((long)(iVar1 * 4) + (long)piVar2);
  memcpy(this->utf8Lengths,otherStringSpan->utf8Lengths,__n);
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSetStringSpan &otherStringSpan,
                                           const UVector &newParentSetStrings)
        : spanSet(otherStringSpan.spanSet), pSpanNotSet(NULL), strings(newParentSetStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(otherStringSpan.utf8Length),
          maxLength16(otherStringSpan.maxLength16), maxLength8(otherStringSpan.maxLength8),
          all(TRUE) {
    if(otherStringSpan.pSpanNotSet==&otherStringSpan.spanSet) {
        pSpanNotSet=&spanSet;
    } else {
        pSpanNotSet=(UnicodeSet *)otherStringSpan.pSpanNotSet->clone();
    }

    // Allocate a block of meta data.
    // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
    int32_t stringsLength=strings.size();
    int32_t allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
    utf8=spanLengths+stringsLength*4;
    uprv_memcpy(utf8Lengths, otherStringSpan.utf8Lengths, allocSize);
}